

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

FilePtr __thiscall
absl::lts_20250127::time_internal::cctz::anon_unknown_0::FOpen
          (anon_unknown_0 *this,char *path,char *mode)

{
  FILE *__p;
  _Head_base<0UL,__IO_FILE_*,_false> extraout_RDX;
  FilePtr FVar1;
  _func_int__IO_FILE_ptr *local_28;
  char *local_20;
  char *mode_local;
  char *path_local;
  
  local_20 = mode;
  mode_local = path;
  path_local = (char *)this;
  __p = fopen(path,mode);
  local_28 = fclose;
  std::unique_ptr<_IO_FILE,int(*)(_IO_FILE*)>::unique_ptr<int(*)(_IO_FILE*),void>
            ((unique_ptr<_IO_FILE,int(*)(_IO_FILE*)> *)this,(pointer)__p,&local_28);
  FVar1._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = extraout_RDX._M_head_impl;
  FVar1._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
  super__Tuple_impl<1UL,_int_(*)(_IO_FILE_*)>.super__Head_base<1UL,_int_(*)(_IO_FILE_*),_false>.
  _M_head_impl = (_Head_base<1UL,_int_(*)(_IO_FILE_*),_false>)
                 (_Head_base<1UL,_int_(*)(_IO_FILE_*),_false>)this;
  return (FilePtr)FVar1._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                  super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>;
}

Assistant:

inline FilePtr FOpen(const char* path, const char* mode) {
#if defined(_MSC_VER)
  FILE* fp;
  if (fopen_s(&fp, path, mode) != 0) fp = nullptr;
  return FilePtr(fp, fclose);
#else
  // TODO: Enable the close-on-exec flag.
  return FilePtr(fopen(path, mode), fclose);
#endif
}